

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestList.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2e961::TestAddingSecondTestAddsItToEndOfList::RunImpl
          (TestAddingSecondTestAddsItToEndOfList *this)

{
  TestResults *pTVar1;
  Test *pTVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  TestDetails local_b0;
  TestList list;
  Test test2;
  Test test1;
  
  UnitTest::Test::Test(&test1,"test1","DefaultSuite","",0);
  UnitTest::Test::Test(&test2,"test2","DefaultSuite","",0);
  UnitTest::TestList::TestList(&list);
  UnitTest::TestList::Add(&list,&test1);
  UnitTest::TestList::Add(&list,&test2);
  pTVar2 = UnitTest::TestList::GetHead(&list);
  if (pTVar2 != &test1) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x22);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_b0,"list.GetHead() == &test1");
  }
  if (test1.next != &test2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x23);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_b0,"test1.next == &test2");
  }
  if (test2.next != (Test *)0x0) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0x24);
    UnitTest::TestResults::OnTestFailure(pTVar1,&local_b0,"test2.next == 0");
  }
  UnitTest::Test::~Test(&test2);
  UnitTest::Test::~Test(&test1);
  return;
}

Assistant:

TEST (AddingSecondTestAddsItToEndOfList)
{
    Test test1("test1");
    Test test2("test2");

    TestList list;
    list.Add(&test1);
    list.Add(&test2);

    CHECK (list.GetHead() == &test1);
    CHECK (test1.next == &test2);
    CHECK (test2.next == 0);
}